

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false>_>_>
::add_to(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false>_>_>
         *this,Index sourceColumnIndex,Index targetColumnIndex)

{
  Index local_1c;
  
  local_1c = targetColumnIndex;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false>_>_>
  ::add_to(&this->reducedMatrixR_,sourceColumnIndex,targetColumnIndex);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false>_>_>
  ::add_to<unsigned_int>(&this->mirrorMatrixU_,&local_1c,sourceColumnIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::add_to(Index sourceColumnIndex, Index targetColumnIndex)
{
  reducedMatrixR_.add_to(sourceColumnIndex, targetColumnIndex);
  // U transposed to avoid row operations
  if constexpr (Master_matrix::Option_list::is_z2)
    mirrorMatrixU_.add_to(targetColumnIndex, sourceColumnIndex);
  else
    mirrorMatrixU_.add_to(sourceColumnIndex, targetColumnIndex);
}